

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O1

void __thiscall Assimp::Ogre::Animation::Animation(Animation *this,Skeleton *parent)

{
  this->parentMesh = (Mesh *)0x0;
  this->parentSkeleton = parent;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->baseName)._M_dataplus._M_p = (pointer)&(this->baseName).field_2;
  (this->baseName)._M_string_length = 0;
  (this->baseName).field_2._M_local_buf[0] = '\0';
  this->length = 0.0;
  this->baseTime = -1.0;
  (this->tracks).
  super__Vector_base<Assimp::Ogre::VertexAnimationTrack,_std::allocator<Assimp::Ogre::VertexAnimationTrack>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tracks).
  super__Vector_base<Assimp::Ogre::VertexAnimationTrack,_std::allocator<Assimp::Ogre::VertexAnimationTrack>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tracks).
  super__Vector_base<Assimp::Ogre::VertexAnimationTrack,_std::allocator<Assimp::Ogre::VertexAnimationTrack>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Animation::Animation(Skeleton *parent) :
    parentMesh(NULL),
    parentSkeleton(parent),
    length(0.0f),
    baseTime(-1.0f)
{
}